

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

void __thiscall VmValue::RemoveUse(VmValue *this,VmValue *user)

{
  VmConstant *pVVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  VmValue **ppVVar5;
  VmConstant **ppVVar6;
  VmInstruction *instruction_00;
  VmBlock *this_00;
  VmBlock *block;
  VmInstruction *instruction;
  int local_3c;
  uint local_38;
  byte local_31;
  uint i_1;
  bool found;
  VariableData *container;
  VmConstant *constant;
  uint e;
  uint i;
  VmValue *user_local;
  VmValue *this_local;
  
  constant._4_4_ = 0;
  constant._0_4_ = (this->users).count;
  for (; _e = user, user_local = this, constant._4_4_ < (uint)constant;
      constant._4_4_ = constant._4_4_ + 1) {
    if ((this->users).data[constant._4_4_] == user) {
      ppVVar5 = SmallArray<VmValue_*,_8U>::back(&this->users);
      (this->users).data[constant._4_4_] = *ppVVar5;
      SmallArray<VmValue_*,_8U>::pop_back(&this->users);
      this->hasKnownNonSimpleUse = false;
      break;
    }
  }
  if ((((this->users).count == 0) && ((this->hasSideEffects & 1U) == 0)) &&
     ((this->canBeRemoved & 1U) != 0)) {
    container = (VariableData *)getType<VmConstant>(this);
    if (container == (VariableData *)0x0) {
      instruction_00 = getType<VmInstruction>(this);
      if (instruction_00 == (VmInstruction *)0x0) {
        this_00 = getType<VmBlock>(this);
        if (this_00 == (VmBlock *)0x0) {
          bVar3 = isType<VmFunction>(this);
          if (!bVar3) {
            __assert_fail("!\"unknown type\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                          ,0x7b1,"void VmValue::RemoveUse(VmValue *)");
          }
        }
        else {
          bVar3 = VmBlock::HasExternalInstructionUsers(this_00);
          if (!bVar3) {
            while (this_00->lastInstruction != (VmInstruction *)0x0) {
              VmBlock::RemoveInstruction(this_00,this_00->lastInstruction);
            }
          }
        }
      }
      else if (instruction_00->parent != (VmBlock *)0x0) {
        VmBlock::RemoveInstruction(instruction_00->parent,instruction_00);
      }
    }
    else {
      _i_1 = (VariableData *)(container->offsetUsers).storage[1].value;
      if (_i_1 != (VariableData *)0x0) {
        local_31 = 0;
        for (local_38 = 0; uVar2 = local_38,
            uVar4 = SmallArray<VmConstant_*,_8U>::size(&_i_1->users), uVar2 < uVar4;
            local_38 = local_38 + 1) {
          ppVVar6 = SmallArray<VmConstant_*,_8U>::operator[](&_i_1->users,local_38);
          if ((VariableData *)*ppVVar6 == container) {
            local_31 = 1;
            ppVVar6 = SmallArray<VmConstant_*,_8U>::back(&_i_1->users);
            pVVar1 = *ppVVar6;
            ppVVar6 = SmallArray<VmConstant_*,_8U>::operator[](&_i_1->users,local_38);
            *ppVVar6 = pVVar1;
            SmallArray<VmConstant_*,_8U>::pop_back(&_i_1->users);
            local_3c = *(int *)&(container->users).allocator + 1;
            instruction = (VmInstruction *)0x0;
            SmallDenseMap<int,_VmConstant_*,_IntHasher,_8U>::insert
                      (&_i_1->offsetUsers,&local_3c,(VmConstant **)&instruction);
            break;
          }
        }
        if ((local_31 & 1) == 0) {
          __assert_fail("found",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                        ,0x79a,"void VmValue::RemoveUse(VmValue *)");
        }
      }
    }
  }
  return;
}

Assistant:

void VmValue::RemoveUse(VmValue* user)
{
	for(unsigned i = 0, e = users.count; i < e; i++)
	{
		if(users.data[i] == user)
		{
			users.data[i] = users.back();
			users.pop_back();

			// Might have removed last non-simple use
			hasKnownNonSimpleUse = false;
			break;
		}
	}

	if(users.count == 0 && !hasSideEffects && canBeRemoved)
	{
		if(VmConstant *constant = getType<VmConstant>(this))
		{
			if(VariableData *container = constant->container)
			{
				bool found = false;

				for(unsigned i = 0; i < container->users.size(); i++)
				{
					if(container->users[i] == constant)
					{
						found = true;

						container->users[i] = container->users.back();
						container->users.pop_back();

						container->offsetUsers.insert(constant->iValue + 1, NULL);
						break;
					}
				}

				(void)found;

				assert(found);
			}
		}
		else if(VmInstruction *instruction = getType<VmInstruction>(this))
		{
			if(instruction->parent)
				instruction->parent->RemoveInstruction(instruction);
		}
		else if(VmBlock *block = getType<VmBlock>(this))
		{
			if(!block->HasExternalInstructionUsers())
			{
				// Remove all block instructions
				while(block->lastInstruction)
					block->RemoveInstruction(block->lastInstruction);
			}
		}
		else if(isType<VmFunction>(this))
		{
			// Do not remove functions
		}
		else
		{
			assert(!"unknown type");
		}
	}
}